

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

_Bool riscv_stop_interrupt(uc_struct_conflict12 *uc,int intno)

{
  if (intno == 3) {
    uc->invalid_error = 0x15;
  }
  else if (intno != 0x8888) {
    return false;
  }
  return true;
}

Assistant:

static bool riscv_stop_interrupt(struct uc_struct *uc, int intno)
{
    // detect stop exception
    switch (intno) {
    default:
        return false;
    case RISCV_EXCP_UNICORN_END:
        return true;
    case RISCV_EXCP_BREAKPOINT:
        uc->invalid_error = UC_ERR_EXCEPTION;
        return true;
    }
}